

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharContent.cpp
# Opt level: O2

vector<CharContent,_std::allocator<CharContent>_> * __thiscall
CharContent::split(vector<CharContent,_std::allocator<CharContent>_> *__return_storage_ptr__,
                  CharContent *this,CharContent *s)

{
  size_t sVar1;
  ulong pos;
  CharContent CStack_58;
  
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<CharContent,_std::allocator<CharContent>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pos = 0;
  while( true ) {
    sVar1 = find(this,s,pos);
    if (sVar1 == this->npos) break;
    if (pos <= sVar1 && sVar1 - pos != 0) {
      subCharContent(&CStack_58,this,pos,sVar1 - pos);
      std::vector<CharContent,_std::allocator<CharContent>_>::emplace_back<CharContent>
                (__return_storage_ptr__,&CStack_58);
      ~CharContent(&CStack_58);
    }
    pos = sVar1 + s->size;
  }
  sVar1 = this->size - pos;
  if (pos <= this->size && sVar1 != 0) {
    subCharContent(&CStack_58,this,pos,sVar1);
    std::vector<CharContent,_std::allocator<CharContent>_>::emplace_back<CharContent>
              (__return_storage_ptr__,&CStack_58);
    ~CharContent(&CStack_58);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CharContent> CharContent::split(const CharContent &s){
	std::vector<CharContent> ans;
	size_t start=0,pos=0;
	while((pos=this->find(s,start))!=this->npos){
		if(pos>start)
			ans.push_back(this->subCharContent(start,pos-start));
		start=pos+s.length();
	}
	if(start<this->size)
		ans.push_back(this->subCharContent(start,this->size-start));
	return ans;
}